

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generate-names.cc
# Opt level: O0

Result wabt::GenerateNames(Module *module,NameOpts opts)

{
  Result RVar1;
  undefined1 local_a0 [8];
  NameGenerator generator;
  NameOpts opts_local;
  Module *module_local;
  
  generator._124_4_ = opts;
  anon_unknown_20::NameGenerator::NameGenerator((NameGenerator *)local_a0,opts);
  RVar1 = anon_unknown_20::NameGenerator::VisitModule((NameGenerator *)local_a0,module);
  anon_unknown_20::NameGenerator::~NameGenerator((NameGenerator *)local_a0);
  return (Result)RVar1.enum_;
}

Assistant:

Result GenerateNames(Module* module, NameOpts opts) {
  NameGenerator generator(opts);
  return generator.VisitModule(module);
}